

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

void __thiscall hmac_hash::SHA1::update(SHA1 *this,uchar *message,size_t length)

{
  const_iterator __position;
  uint8_t *buffer;
  pointer puVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  SHA1 *pSVar2;
  uchar *__first;
  long lVar3;
  ulong uVar4;
  uint32_t block [16];
  uint32_t local_78 [18];
  
  this_00 = &this->m_buffer;
  __position._M_current =
       (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar3 = (long)(this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start - (long)__position._M_current;
  pSVar2 = (SHA1 *)this_00;
  if (lVar3 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = lVar3 + 0x40;
    if (length <= uVar4) {
      uVar4 = length;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,__position,message,
               message + uVar4);
    buffer = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)buffer == 0x40) {
      buffer_to_block(pSVar2,buffer,local_78);
      pSVar2 = this;
      transform(this,local_78);
      puVar1 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish != puVar1) {
        (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar1;
      }
    }
  }
  __first = message + uVar4;
  while (uVar4 = uVar4 + 0x40, uVar4 <= length) {
    buffer_to_block(pSVar2,__first,local_78);
    pSVar2 = this;
    transform(this,local_78);
    __first = __first + 0x40;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
             (const_iterator)
             (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,__first,message + length);
  return;
}

Assistant:

void SHA1::update(const unsigned char *message, size_t length) {
        size_t offset = 0;

        // Fill buffer if it has existing bytes
        if (!m_buffer.empty()) {
            size_t to_copy = std::min(BLOCK_SIZE - m_buffer.size(), length);
            m_buffer.insert(m_buffer.end(), message, message + to_copy);
            offset += to_copy;

            if (m_buffer.size() == BLOCK_SIZE) {
                uint32_t block[16];
                buffer_to_block(m_buffer.data(), block);
                transform(block);
                m_buffer.clear();
            }
        }

        // Process full blocks directly from message
        while (offset + BLOCK_SIZE <= length) {
            uint32_t block[16];
            buffer_to_block(message + offset, block);
            transform(block);
            offset += BLOCK_SIZE;
        }

        // Store remaining bytes in buffer
        m_buffer.insert(m_buffer.end(), message + offset, message + length);
    }